

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall trun::Config::Dump(Config *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  string *psVar4;
  reference pbVar5;
  ResultSummary *this_00;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Config *this_local;
  
  printf("Current Configuration\n");
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->version);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->description);
  printf("TestRunner v%s - %s\n",pcVar2,pcVar3);
  pcVar2 = "no";
  if (this->verbose != 0) {
    pcVar2 = "yes";
  }
  printf("  Verbose....: %s (%d)\n",pcVar2,(ulong)(uint)this->verbose);
  pcVar2 = "no";
  if ((this->listTests & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  List Tests.: %s\n",pcVar2);
  pcVar2 = "no";
  if ((this->executeTests & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  Run Tests..: %s\n",pcVar2);
  pcVar2 = "no";
  if ((this->printPassSummary & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  Pass in summary: %s\n",pcVar2);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->mainFuncName);
  printf("  TestMain...: %s\n",pcVar2);
  pcVar2 = "no";
  if ((this->testModuleGlobals & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  Test Module Globals: %s\n",pcVar2);
  pcVar2 = "no";
  if ((this->testGlobalMain & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  Test Main Global: %s\n",pcVar2);
  pcVar2 = "no";
  if ((this->testLogFilter & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  TestCase Log Filter: %s\n",pcVar2);
  printf("  Response Message Size Limit: %u\n",(ulong)this->responseMsgByteLimit);
  pcVar2 = "no";
  if ((this->skipOnModuleFail & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  Skip rest on library failure: %s\n",pcVar2);
  pcVar2 = "no";
  if ((this->stopOnAllFail & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  Stop on full failure: %s\n",pcVar2);
  pcVar2 = "no";
  if ((this->suppressProgressMsg & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  Silent mode: %s\n",pcVar2);
  pcVar2 = "no";
  if ((this->discardTestReturnCode & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  Discard test return code: %s\n",pcVar2);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->reportingModule);
  printf("  Reporting module: %s\n",pcVar2);
  printf("  Reporting indent size: %d\n",(ulong)(uint)this->reportIndent);
  psVar4 = ModuleExecutionTypeToStr_abi_cxx11_(this->moduleExecuteType);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (psVar4);
  printf("  Module execution policy: %s\n",pcVar2);
  psVar4 = TestExecutionTypeToStr_abi_cxx11_(this->testExecutionType);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (psVar4);
  printf("  Testcase execution policy: %s\n",pcVar2);
  pcVar2 = "no";
  if ((this->continueOnAssert & 1U) != 0) {
    pcVar2 = "yes";
  }
  printf("  Continue on assert: %s\n",pcVar2);
  printf("  Modules:\n");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->modules);
  x.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->modules);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&x.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_48,pbVar5);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
    printf("    %s\n",pcVar2);
    std::__cxx11::string::~string((string *)local_48);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  printf("  Test cases:\n");
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->testcases);
  x_1.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->testcases);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&x_1.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
    std::__cxx11::string::string((string *)&__range1_2,pbVar5);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &__range1_2);
    printf("    %s\n",pcVar2);
    std::__cxx11::string::~string((string *)&__range1_2);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  printf("  Inputs:\n");
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->inputs);
  x_2.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->inputs);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&__end1_2,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&x_2.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_2);
    std::__cxx11::string::string((string *)local_c8,pbVar5);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_c8);
    printf("    %s\n",pcVar2);
    std::__cxx11::string::~string((string *)local_c8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  this_00 = ResultSummary::Instance();
  ResultSummary::ListReportingModules(this_00);
  printf("\n");
  return;
}

Assistant:

void Config::Dump() {
    printf("Current Configuration\n");
    printf("TestRunner v%s - %s\n", version.c_str(), description.c_str());
    printf("  Verbose....: %s (%d)\n",verbose?"yes":"no", verbose);
    printf("  List Tests.: %s\n", listTests?"yes":"no");
    printf("  Run Tests..: %s\n", executeTests?"yes":"no");
    printf("  Pass in summary: %s\n", printPassSummary?"yes":"no");
    printf("  TestMain...: %s\n", mainFuncName.c_str());
    printf("  Test Module Globals: %s\n", testModuleGlobals ? "yes" : "no");
    printf("  Test Main Global: %s\n", testGlobalMain?"yes":"no");
    printf("  TestCase Log Filter: %s\n", testLogFilter?"yes":"no");
    printf("  Response Message Size Limit: %" PRIu32 "\n", responseMsgByteLimit);
    printf("  Skip rest on library failure: %s\n", skipOnModuleFail?"yes":"no");
    printf("  Stop on full failure: %s\n", stopOnAllFail?"yes":"no");
    printf("  Silent mode: %s\n", suppressProgressMsg?"yes":"no");
    printf("  Discard test return code: %s\n", discardTestReturnCode?"yes":"no");
    printf("  Reporting module: %s\n", reportingModule.c_str());
    printf("  Reporting indent size: %d\n", reportIndent);
    printf("  Module execution policy: %s\n", ModuleExecutionTypeToStr(moduleExecuteType).c_str());
    printf("  Testcase execution policy: %s\n", TestExecutionTypeToStr(testExecutionType).c_str());
    printf("  Continue on assert: %s\n", continueOnAssert?"yes":"no");
    printf("  Modules:\n");
    for(auto x:modules) {
        printf("    %s\n", x.c_str());
    }
    printf("  Test cases:\n");
    for(auto x:testcases) {
        printf("    %s\n", x.c_str());
    }
    printf("  Inputs:\n");
    for(auto x:inputs) {
        printf("    %s\n", x.c_str());

    }
    ResultSummary::Instance().ListReportingModules();
    printf("\n");

}